

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shproject.hpp
# Opt level: O3

void __thiscall SymmSH<15>::SymmSH(SymmSH<15> *this,function<float_(float)> *func,int nsample)

{
  long lVar1;
  float fVar2;
  double dVar3;
  int i;
  long lVar4;
  int iVar5;
  float __x;
  float fVar6;
  float fVar7;
  vec3f w;
  double acc [15];
  float y [225];
  float local_450;
  vec3f local_44c;
  double local_440;
  double local_438 [16];
  float local_3b8 [226];
  
  this->a[0xb] = 0.0;
  this->a[0xc] = 0.0;
  this->a[0xd] = 0.0;
  this->a[0xe] = 0.0;
  this->a[8] = 0.0;
  this->a[9] = 0.0;
  this->a[10] = 0.0;
  this->a[0xb] = 0.0;
  this->a[4] = 0.0;
  this->a[5] = 0.0;
  this->a[6] = 0.0;
  this->a[7] = 0.0;
  this->a[0] = 0.0;
  this->a[1] = 0.0;
  this->a[2] = 0.0;
  this->a[3] = 0.0;
  local_438[0xc] = 0.0;
  local_438[0xd] = 0.0;
  local_438[10] = 0.0;
  local_438[0xb] = 0.0;
  local_438[8] = 0.0;
  local_438[9] = 0.0;
  local_438[6] = 0.0;
  local_438[7] = 0.0;
  local_438[4] = 0.0;
  local_438[5] = 0.0;
  local_438[2] = 0.0;
  local_438[3] = 0.0;
  local_438[0] = 0.0;
  local_438[1] = 0.0;
  local_438[0xe] = 0.0;
  if (nsample < 1) {
    local_440 = (double)nsample;
  }
  else {
    local_440 = (double)nsample;
    iVar5 = 0;
    do {
      __x = (float)((((double)iVar5 + 0.5) * (double)PI) / local_440);
      fVar6 = sinf(__x);
      local_44c.z = cosf(__x);
      local_44c.y = 0.0;
      local_44c.x = fVar6;
      SHEvaluate(&local_44c,0xe,local_3b8);
      local_450 = __x;
      if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      fVar6 = (*func->_M_invoker)((_Any_data *)func,&local_450);
      lVar4 = 0;
      do {
        lVar1 = lVar4 + 1;
        fVar2 = local_3b8[lVar1 * lVar4];
        fVar7 = sinf(__x);
        local_438[lVar4] = (double)(fVar7 * fVar2 * fVar6) + local_438[lVar4];
        lVar4 = lVar1;
      } while (lVar1 != 0xf);
      iVar5 = iVar5 + 1;
    } while (iVar5 != nsample);
  }
  dVar3 = (double)PI;
  lVar4 = 0;
  do {
    this->a[lVar4] = (float)(((local_438[lVar4] + local_438[lVar4]) * dVar3 * dVar3) / local_440);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xf);
  return;
}

Assistant:

SymmSH<n>::SymmSH(std::function<float(float)> func, int nsample)
{
    double acc[n];
    memset(acc, 0, sizeof acc);
    float y[n*n];
    for (int i=0; i<nsample; ++i)
    {
        float theta = PI*(i+0.5)/nsample;
        vec3f w(sin(theta), 0, cos(theta));
        SHEvaluate(w, n-1, y);
        float f = func(theta);
        for (int i=0; i<n; ++i)
            acc[i] += f * y[SHIndex(i,0)] * sin(theta);
    }
    for (int i=0; i<n; ++i)
        a[i] = acc[i] * 2*PI*PI / nsample;
}